

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityReader::tryRead
          (HttpFixedLengthEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Coroutine<unsigned_long> *this_00;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  Array<char> *this_01;
  HttpInputStreamImpl *this_02;
  unsigned_long uVar1;
  SourceLocation location;
  bool bVar2;
  coroutine_handle<void> handle;
  HttpInputStreamImpl *buffer_00;
  long lVar3;
  unsigned_long *puVar4;
  long lVar5;
  long in_R8;
  unsigned_long *in_R9;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  
  handle._M_fr_ptr = operator_new(0x460);
  *(code **)handle._M_fr_ptr = tryRead;
  *(code **)((long)handle._M_fr_ptr + 8) = tryRead;
  this_00 = (Coroutine<unsigned_long> *)((long)handle._M_fr_ptr + 0x10);
  *(void **)((long)handle._M_fr_ptr + 0x428) = buffer;
  _kjCondition.value = (bool *)anon_var_dwarf_9a3139;
  location.function = "tryRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x7c5;
  location.columnNumber = 0x13;
  kj::_::Coroutine<unsigned_long>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<unsigned_long>::get_return_object((Coroutine<unsigned_long> *)this);
  _kjCondition.value = (bool *)((long)buffer + 0x20);
  if (*(char *)((long)buffer + 0x20) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[59]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x7c6,FAILED,"clean",
               "_kjCondition,\"can\'t read more data after a previous read didn\'t complete\"",
               &_kjCondition,
               (char (*) [59])"can\'t read more data after a previous read didn\'t complete");
    kj::_::Debug::Fault::fatal(&f);
  }
  __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x240);
  this_01 = (Array<char> *)((long)handle._M_fr_ptr + 0x400);
  this_02 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x420);
  *(undefined1 *)((long)buffer + 0x20) = 0;
  lVar3 = *(long *)((long)buffer + 0x18);
  puVar4 = (unsigned_long *)((long)handle._M_fr_ptr + 0x430);
  lVar5 = 0;
  do {
    *(void **)((long)handle._M_fr_ptr + 0x450) = buffer;
    *(size_t *)((long)handle._M_fr_ptr + 0x448) = minBytes;
    *(size_t *)((long)handle._M_fr_ptr + 0x440) = maxBytes;
    *(long *)((long)handle._M_fr_ptr + 0x438) = in_R8;
    *(long *)((long)handle._M_fr_ptr + 0x430) = lVar5;
    *(long *)((long)handle._M_fr_ptr + 0x418) = lVar5;
    if (lVar3 == 0) {
      *(undefined1 *)&(*(HttpEntityBodyReader **)((long)handle._M_fr_ptr + 0x428))[1].weakInner.ptr
           = 1;
      kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,0);
LAB_0036ba64:
      *(undefined8 *)handle._M_fr_ptr = 0;
      *(undefined1 *)((long)handle._M_fr_ptr + 0x458) = 1;
      return (PromiseBase)(PromiseBase)this;
    }
    buffer_00 = HttpEntityBodyReader::getInner
                          (*(HttpEntityBodyReader **)((long)handle._M_fr_ptr + 0x428));
    HttpInputStreamImpl::tryRead(this_02,buffer_00,minBytes,1);
    co_await<unsigned_long>(__return_storage_ptr__,(Promise<unsigned_long> *)this_02);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x458) = 0;
    bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar2) {
      return (PromiseBase)(PromiseBase)this;
    }
    buffer = (void *)kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
    lVar3 = *(long *)(*(long *)((long)handle._M_fr_ptr + 0x428) + 0x18) - (long)buffer;
    *(long *)(*(long *)((long)handle._M_fr_ptr + 0x428) + 0x18) = lVar3;
    if (lVar3 == 0) {
      HttpEntityBodyReader::doneReading(*(HttpEntityBodyReader **)((long)handle._M_fr_ptr + 0x428));
LAB_0036ba4a:
      uVar1 = *puVar4;
      *(undefined1 *)(*(long *)((long)handle._M_fr_ptr + 0x428) + 0x20) = 1;
      kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,
                 uVar1 + (long)buffer);
      goto LAB_0036ba64;
    }
    if (buffer == (void *)0x0) {
      f.exception = (Exception *)(lVar3 + *puVar4);
      kj::_::Debug::makeDescription<char_const(&)[64],unsigned_long&,unsigned_long&>
                ((String *)this_01,
                 (Debug *)
                 "\"premature EOF in HTTP entity body; did not reach Content-Length\", expectedLength, alreadyRead"
                 ,"premature EOF in HTTP entity body; did not reach Content-Length",
                 (char (*) [64])&f,(unsigned_long *)((long)handle._M_fr_ptr + 0x418),in_R9);
      Exception::Exception
                ((Exception *)&_kjCondition,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x7df,(String *)this_01);
      throwRecoverableException((Exception *)&_kjCondition,0);
      Exception::~Exception((Exception *)&_kjCondition);
      Array<char>::~Array(this_01);
      puVar4 = (unsigned_long *)((long)handle._M_fr_ptr + 0x418);
      goto LAB_0036ba4a;
    }
    maxBytes = (long)*(void **)((long)handle._M_fr_ptr + 0x440) - (long)buffer;
    if (*(void **)((long)handle._M_fr_ptr + 0x440) < buffer || maxBytes == 0) goto LAB_0036ba4a;
    minBytes = *(long *)((long)handle._M_fr_ptr + 0x448) + (long)buffer;
    in_R8 = *(long *)((long)handle._M_fr_ptr + 0x438) - (long)buffer;
    lVar5 = *(long *)((long)handle._M_fr_ptr + 0x430) + (long)buffer;
  } while( true );
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(clean, "can't read more data after a previous read didn't complete");
    clean = false;

    size_t alreadyRead = 0;

    for (;;) {
      if (length == 0) {
        clean = true;
        co_return 0;
      }

      // We have to set minBytes to 1 here so that if we read any data at all, we update our
      // counter immediately, so that we still know where we are in case of cancellation.
      auto amount = co_await getInner().tryRead(buffer, 1, kj::min(maxBytes, length));

      length -= amount;
      if (length > 0) {
        // We haven't reached the end of the entity body yet.
        if (amount == 0) {
          size_t expectedLength = length + alreadyRead;
          kj::throwRecoverableException(KJ_EXCEPTION(
            DISCONNECTED,
            "premature EOF in HTTP entity body; did not reach Content-Length",
            expectedLength,
            alreadyRead
          ));
        } else if (amount < minBytes) {
          // We requested a minimum 1 byte above, but our own caller actually set a larger minimum
          // which has not yet been reached. Keep trying until we reach it.
          buffer = reinterpret_cast<byte*>(buffer) + amount;
          minBytes -= amount;
          maxBytes -= amount;
          alreadyRead += amount;
          continue;
        }
      } else if (length == 0) {
        doneReading();
      }
      clean = true;
      co_return amount + alreadyRead;
    }
  }